

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUploadCommand.cxx
# Opt level: O0

bool __thiscall cmCTestUploadCommand::CheckArgumentValue(cmCTestUploadCommand *this,string *arg)

{
  cmMakefile *this_00;
  char *filename_00;
  ostream *poVar1;
  string local_200;
  undefined1 local_1e0 [8];
  ostringstream e;
  undefined1 local_40 [8];
  string filename;
  string *arg_local;
  cmCTestUploadCommand *this_local;
  
  filename.field_2._8_8_ = arg;
  if ((this->super_cmCTestHandlerCommand).ArgumentDoing == 3) {
    std::__cxx11::string::string((string *)local_40,(string *)arg);
    filename_00 = (char *)std::__cxx11::string::c_str();
    this_local._7_1_ = cmsys::SystemTools::FileExists(filename_00);
    if (this_local._7_1_) {
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(&this->Files,(value_type *)local_40);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
      poVar1 = std::operator<<((ostream *)local_1e0,"File \"");
      poVar1 = std::operator<<(poVar1,(string *)local_40);
      poVar1 = std::operator<<(poVar1,"\" does not exist. Cannot submit ");
      std::operator<<(poVar1,"a non-existent file.");
      this_00 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_200);
      std::__cxx11::string::~string((string *)&local_200);
      (this->super_cmCTestHandlerCommand).ArgumentDoing = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
    }
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    this_local._7_1_ =
         cmCTestHandlerCommand::CheckArgumentValue(&this->super_cmCTestHandlerCommand,arg);
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTestUploadCommand::CheckArgumentValue(std::string const& arg)
{
  if(this->ArgumentDoing == ArgumentDoingFiles)
    {
    std::string filename(arg);
    if(cmSystemTools::FileExists(filename.c_str()))
      {
      this->Files.insert(filename);
      return true;
      }
    else
      {
      std::ostringstream e;
      e << "File \"" << filename << "\" does not exist. Cannot submit "
          << "a non-existent file.";
      this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
      this->ArgumentDoing = ArgumentDoingError;
      return false;
      }
    }

  // Look for other arguments.
  return this->Superclass::CheckArgumentValue(arg);
}